

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2f8087::SQLiteBuildDB::buildStarted(SQLiteBuildDB *this,string *error_out)

{
  int iVar1;
  int __oflag;
  bool bVar2;
  string local_48;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->dbMutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  iVar1 = open(this,(char *)error_out,__oflag);
  if ((char)iVar1 != '\0') {
    iVar1 = sqlite3_exec(this->db,"BEGIN EXCLUSIVE;",0,0,0);
    bVar2 = iVar1 == 0;
    if (bVar2) goto LAB_001692bc;
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_48,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = false;
LAB_001692bc:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar2;
}

Assistant:

virtual bool buildStarted(std::string *error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out))
      return false;

    // Execute the entire build inside a single transaction.
    //
    // FIXME: We should revist this, as we probably wouldn't want a crash in the
    // build system to totally lose all build results.
    int result = sqlite3_exec(db, "BEGIN EXCLUSIVE;", nullptr, nullptr, nullptr);

    if (result != SQLITE_OK) {
      *error_out = getCurrentErrorMessage();
      return false;
    }

    return true;
  }